

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

void __thiscall
Js::FunctionExecutionStateMachine::CommitExecutedIterations(FunctionExecutionStateMachine *this)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  uint16 uVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  FunctionBody *this_00;
  FunctionEntryPointInfo *pFVar7;
  Type *local_40;
  Type *local_30;
  FunctionExecutionStateMachine *this_local;
  
  if ((this->initializedExecutionModeAndLimits & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x2f7,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  EVar3 = GetExecutionMode(this);
  switch(EVar3) {
  case Interpreter:
    uVar5 = GetInterpretedCount(this);
    CommitExecutedIterations(this,&this->interpreterLimit,uVar5);
    break;
  case AutoProfilingInterpreter:
    if ((this->autoProfilingInterpreter0Limit == 0) && (this->profilingInterpreter0Limit == 0)) {
      local_30 = &this->autoProfilingInterpreter1Limit;
    }
    else {
      local_30 = &this->autoProfilingInterpreter0Limit;
    }
    uVar5 = GetInterpretedCount(this);
    CommitExecutedIterations(this,local_30,uVar5);
    break;
  case ProfilingInterpreter:
    this_00 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
    pFVar7 = FunctionBody::GetSimpleJitEntryPointInfo(this_00);
    if (pFVar7 == (FunctionEntryPointInfo *)0x0) {
      local_40 = &this->profilingInterpreter0Limit;
    }
    else {
      local_40 = &this->profilingInterpreter1Limit;
    }
    uVar5 = GetInterpretedCount(this);
    CommitExecutedIterations(this,local_40,uVar5);
    break;
  case SimpleJit:
    uVar4 = GetSimpleJitExecutedIterations(this);
    CommitExecutedIterations(this,&this->simpleJitLimit,(uint)uVar4);
    break;
  case FullJit:
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x317,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return;
}

Assistant:

void FunctionExecutionStateMachine::CommitExecutedIterations()
    {
        Assert(initializedExecutionModeAndLimits);

        switch (GetExecutionMode())
        {
        case ExecutionMode::Interpreter:
            CommitExecutedIterations(interpreterLimit, GetInterpretedCount());
            break;

        case ExecutionMode::AutoProfilingInterpreter:
            CommitExecutedIterations(
                autoProfilingInterpreter0Limit == 0 && profilingInterpreter0Limit == 0
                ? autoProfilingInterpreter1Limit
                : autoProfilingInterpreter0Limit,
                GetInterpretedCount());
            break;

        case ExecutionMode::ProfilingInterpreter:
            CommitExecutedIterations(
                owner->GetSimpleJitEntryPointInfo()
                ? profilingInterpreter1Limit
                : profilingInterpreter0Limit,
                GetInterpretedCount());
            break;

        case ExecutionMode::SimpleJit:
            CommitExecutedIterations(simpleJitLimit, GetSimpleJitExecutedIterations());
            break;

        case ExecutionMode::FullJit:
            break;

        default:
            Assert(false);
            __assume(false);
        }
    }